

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

QString * __thiscall
CPP::WriteInitialization::writeStringListProperty
          (QString *__return_storage_ptr__,WriteInitialization *this,DomStringList *list)

{
  bool bVar1;
  Language LVar2;
  QTextStream *pQVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  char local_c1;
  QString local_b8;
  QString local_a0;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_48,__return_storage_ptr__,3);
  LVar2 = language::language();
  if (LVar2 == Python) {
    QTextStream::operator<<((QTextStream *)&local_48,'[');
    local_c1 = ']';
  }
  else if (LVar2 == Cpp) {
    local_c1 = '}';
    QTextStream::operator<<((QTextStream *)&local_48,"QStringList{");
  }
  else {
    local_c1 = '}';
  }
  local_68.d = (list->m_string).d.d;
  local_68.ptr = (list->m_string).d.ptr;
  local_68.size = (list->m_string).d.size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_68.size != 0) {
    bVar1 = needsTranslation<DomStringList>(list);
    if (bVar1) {
      local_88.d.d = (list->m_attr_comment).d.d;
      local_88.d.ptr = (list->m_attr_comment).d.ptr;
      local_88.d.size = (list->m_attr_comment).d.size;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_68.size != 0) {
        lVar4 = 0;
        uVar5 = local_68.size;
        do {
          pQVar3 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_48,'\n');
          pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&this->m_indent);
          pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"    ");
          local_b8.d.d = (Data *)0x0;
          local_b8.d.ptr = (char16_t *)0x0;
          local_b8.d.size = 0;
          trCall(&local_a0,this,(QString *)((long)&((local_68.ptr)->d).d + lVar4),&local_88,
                 &local_b8);
          QTextStream::operator<<(pQVar3,&local_a0);
          if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (uVar5 != 1) {
            QTextStream::operator<<((QTextStream *)&local_48,',');
          }
          lVar4 = lVar4 + 0x18;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else if (local_68.size != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        if (uVar5 != 0) {
          QTextStream::operator<<((QTextStream *)&local_48,", ");
        }
        language::_formatString
                  ((QTextStream *)&local_48,(QString *)((long)&((local_68.ptr)->d).d + lVar4),
                   &this->m_dindent,true);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar5 < (ulong)local_68.size);
    }
  }
  QTextStream::operator<<((QTextStream *)&local_48,local_c1);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  QTextStream::~QTextStream((QTextStream *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString WriteInitialization::writeStringListProperty(const DomStringList *list) const
{
    QString propertyValue;
    QTextStream str(&propertyValue);
    char trailingDelimiter = '}';
    switch (language::language()) {
     case Language::Cpp:
        str << "QStringList{";
        break;
    case Language::Python:
       str << '[';
       trailingDelimiter = ']';
       break;
    }
    const QStringList values = list->elementString();
    if (!values.isEmpty()) {
        if (needsTranslation(list)) {
            const QString comment = list->attributeComment();
            const qsizetype last = values.size() - 1;
            for (qsizetype i = 0; i <= last; ++i) {
                str << '\n' << m_indent << "    " << trCall(values.at(i), comment);
                if (i != last)
                    str << ',';
            }
        } else {
            for (qsizetype i = 0; i < values.size(); ++i) {
                if (i)
                    str << ", ";
                str << language::qstring(values.at(i), m_dindent);
            }
        }
    }
    str << trailingDelimiter;
    return propertyValue;
}